

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::allocate_resources(NaPNStatistics *this)

{
  NaVector *pNVar1;
  NaPetriCnInput *this_00;
  NaVector *pNVar2;
  long in_RDI;
  NaPetriCnInput *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  uint uVar3;
  NaVector *in_stack_ffffffffffffffe0;
  
  uVar3 = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pNVar1 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
  (*pNVar1->_vptr_NaVector[6])();
  NaVector::new_dim(in_stack_ffffffffffffffe0,uVar3);
  pNVar1 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
  (*pNVar1->_vptr_NaVector[6])();
  NaVector::new_dim(in_stack_ffffffffffffffe0,uVar3);
  this_00 = (NaPetriCnInput *)(in_RDI + 0x128);
  pNVar1 = NaPetriCnInput::data(this_00);
  (*pNVar1->_vptr_NaVector[6])();
  NaVector::new_dim(in_stack_ffffffffffffffe0,uVar3);
  pNVar1 = NaPetriCnInput::data(this_00);
  (*pNVar1->_vptr_NaVector[6])();
  NaVector::new_dim(in_stack_ffffffffffffffe0,uVar3);
  uVar3 = (uint)((ulong)(in_RDI + 0x170) >> 0x20);
  pNVar1 = NaPetriCnInput::data(this_00);
  (*pNVar1->_vptr_NaVector[6])();
  NaVector::new_dim(in_stack_ffffffffffffffe0,uVar3);
  pNVar1 = (NaVector *)(in_RDI + 0x198);
  pNVar2 = NaPetriCnInput::data(this_00);
  (*pNVar2->_vptr_NaVector[6])();
  NaVector::new_dim(pNVar1,uVar3);
  pNVar2 = NaPetriCnInput::data(this_00);
  (*pNVar2->_vptr_NaVector[6])();
  NaVector::new_dim(pNVar1,uVar3);
  return;
}

Assistant:

void
NaPNStatistics::allocate_resources ()
{
    Mean.new_dim(signal.data().dim());
    StdDev.new_dim(signal.data().dim());
    RMS.new_dim(signal.data().dim());
    Min.new_dim(signal.data().dim());
    Max.new_dim(signal.data().dim());

    Sum.new_dim(signal.data().dim());
    Sum2.new_dim(signal.data().dim());
}